

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImage.cpp
# Opt level: O0

int Imf_3_4::anon_unknown_8::computeNumYLevels
              (Box2i *dataWindow,LevelMode levelMode,LevelRoundingMode levelRoundingMode)

{
  LevelRoundingMode in_ESI;
  int *in_RDI;
  int h_1;
  int h;
  int w;
  int n;
  int in_stack_ffffffffffffffe0;
  int local_1c;
  int local_18;
  int local_14;
  
  local_14 = 0;
  if (in_ESI == ROUND_DOWN) {
    local_14 = 1;
  }
  else if (in_ESI == ROUND_UP) {
    local_18 = (in_RDI[2] - *in_RDI) + 1;
    local_1c = (in_RDI[3] - in_RDI[1]) + 1;
    std::max<int>(&local_18,&local_1c);
    local_14 = roundLog2(in_stack_ffffffffffffffe0,in_ESI);
    local_14 = local_14 + 1;
  }
  else if (in_ESI == NUM_ROUNDINGMODES) {
    local_14 = roundLog2((in_RDI[3] - in_RDI[1]) + 1,NUM_ROUNDINGMODES);
    local_14 = local_14 + 1;
  }
  return local_14;
}

Assistant:

int
computeNumYLevels (
    const Box2i&      dataWindow,
    LevelMode         levelMode,
    LevelRoundingMode levelRoundingMode)
{
    int n = 0;

    switch (levelMode)
    {
        case ONE_LEVEL: n = 1; break;

        case MIPMAP_LEVELS:

        {
            int w = dataWindow.max.x - dataWindow.min.x + 1;
            int h = dataWindow.max.y - dataWindow.min.y + 1;
            n     = roundLog2 (std::max (w, h), levelRoundingMode) + 1;
        }
        break;

        case RIPMAP_LEVELS:

        {
            int h = dataWindow.max.y - dataWindow.min.y + 1;
            n     = roundLog2 (h, levelRoundingMode) + 1;
        }
        break;

        default: assert (false);
    }

    return n;
}